

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O1

void __thiscall
boost::deflate::deflate_stream_test::doMatrix
          (deflate_stream_test *this,ICompressor *c,string *check,pmf_t pmf)

{
  int iVar1;
  code *pcVar2;
  int level;
  int iVar3;
  long in_R8;
  long *plVar4;
  int strategy;
  int iVar5;
  int memLevel;
  int iVar6;
  
  plVar4 = (long *)((long)&(this->zlib_compressor).super_ICompressor._vptr_ICompressor + in_R8);
  iVar3 = 0;
  do {
    iVar1 = 8;
    do {
      if (iVar1 != 8) {
        iVar5 = 0;
        do {
          iVar6 = 8;
          do {
            pcVar2 = (code *)pmf;
            if ((pmf & 1) != 0) {
              pcVar2 = *(code **)(*plVar4 + -1 + pmf);
            }
            (*pcVar2)(plVar4,c,iVar3,9,iVar6,iVar5,check);
            iVar6 = iVar6 + 1;
          } while (iVar6 != 10);
          iVar5 = iVar5 + 1;
        } while (iVar5 != 5);
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 != 10);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 10);
  if ((pmf & 1) != 0) {
    pmf = *(undefined8 *)(*plVar4 + -1 + pmf);
  }
  (*(code *)pmf)(plVar4,c,0xffffffff,0xf,8,0,check);
  return;
}

Assistant:

void doMatrix(ICompressor& c, std::string const& check, pmf_t pmf)
    {
        for(int level = 0; level <= 9; ++level)
        {
            for(int windowBits = 8; windowBits <= 9; ++windowBits)
            {
                // zlib has a bug with windowBits==8
                if(windowBits == 8)
                    continue;
                for(int strategy = 0; strategy <= 4; ++strategy)
                {
                    for (int memLevel = 8; memLevel <= 9; ++memLevel)
                    {
                        (this->*pmf)(
                            c, level, windowBits, memLevel, strategy, check);
                    }
                }
            }
        }

        // Check default settings
        (this->*pmf)(c, compression::default_size, 15, 8, 0, check);
    }